

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

void zlib_match(LZ77Context *ectx,int distance,int len)

{
  Outbuf *out_00;
  int iVar1;
  int iVar2;
  coderecord *pcVar3;
  int local_4c;
  int local_48;
  int thislen;
  Outbuf *out;
  int local_30;
  int k;
  int j;
  int i;
  coderecord *l;
  coderecord *d;
  int len_local;
  int distance_local;
  LZ77Context *ectx_local;
  
  out_00 = (Outbuf *)ectx->userdata;
  d._0_4_ = len;
  do {
    if ((int)d < 1) {
      return;
    }
    if ((int)d < 0x105) {
      if ((int)d < 0x103) {
        local_4c = (int)d;
      }
      else {
        local_4c = (int)d + -3;
      }
      local_48 = local_4c;
    }
    else {
      local_48 = 0x102;
    }
    d._0_4_ = (int)d - local_48;
    k = -1;
    local_30 = 0x1d;
    iVar1 = local_30;
    do {
      local_30 = iVar1;
      if (local_30 - k < 2) {
        __assert_fail("j - i >= 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c"
                      ,0x1fe,"void zlib_match(struct LZ77Context *, int, int)");
      }
      iVar2 = (local_30 + k) / 2;
      iVar1 = iVar2;
    } while ((local_48 < lencodes[iVar2].min) ||
            (iVar1 = local_30, k = iVar2, lencodes[iVar2].max < local_48));
    pcVar3 = lencodes + iVar2;
    if (pcVar3->code < 0x118) {
      outbits(out_00,(ulong)""[(pcVar3->code + -0x100) * 2],7);
    }
    else {
      outbits(out_00,(ulong)""[pcVar3->code + -0x58],8);
    }
    if (lencodes[iVar2].extrabits != 0) {
      outbits(out_00,(long)(local_48 - lencodes[iVar2].min),(int)lencodes[iVar2].extrabits);
    }
    k = -1;
    local_30 = 0x1e;
    iVar1 = local_30;
    do {
      local_30 = iVar1;
      if (local_30 - k < 2) {
        __assert_fail("j - i >= 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c"
                      ,0x222,"void zlib_match(struct LZ77Context *, int, int)");
      }
      iVar2 = (local_30 + k) / 2;
      iVar1 = iVar2;
    } while ((distance < distcodes[iVar2].min) ||
            (iVar1 = local_30, k = iVar2, distcodes[iVar2].max < distance));
    outbits(out_00,(ulong)""[(int)distcodes[iVar2].code << 3],5);
    if (distcodes[iVar2].extrabits != 0) {
      outbits(out_00,(long)(distance - distcodes[iVar2].min),(int)distcodes[iVar2].extrabits);
    }
  } while( true );
}

Assistant:

static void zlib_match(struct LZ77Context *ectx, int distance, int len)
{
    const coderecord *d, *l;
    int i, j, k;
    struct Outbuf *out = (struct Outbuf *) ectx->userdata;

    while (len > 0) {
        int thislen;

        /*
         * We can transmit matches of lengths 3 through 258
         * inclusive. So if len exceeds 258, we must transmit in
         * several steps, with 258 or less in each step.
         *
         * Specifically: if len >= 261, we can transmit 258 and be
         * sure of having at least 3 left for the next step. And if
         * len <= 258, we can just transmit len. But if len == 259
         * or 260, we must transmit len-3.
         */
        thislen = (len > 260 ? 258 : len <= 258 ? len : len - 3);
        len -= thislen;

        /*
         * Binary-search to find which length code we're
         * transmitting.
         */
        i = -1;
        j = lenof(lencodes);
        while (1) {
            assert(j - i >= 2);
            k = (j + i) / 2;
            if (thislen < lencodes[k].min)
                j = k;
            else if (thislen > lencodes[k].max)
                i = k;
            else {
                l = &lencodes[k];
                break;                 /* found it! */
            }
        }

        /*
         * Transmit the length code. 256-279 are seven bits
         * starting at 0000000; 280-287 are eight bits starting at
         * 11000000.
         */
        if (l->code <= 279) {
            outbits(out, mirrorbytes[(l->code - 256) * 2], 7);
        } else {
            outbits(out, mirrorbytes[0xc0 - 280 + l->code], 8);
        }

        /*
         * Transmit the extra bits.
         */
        if (l->extrabits)
            outbits(out, thislen - l->min, l->extrabits);

        /*
         * Binary-search to find which distance code we're
         * transmitting.
         */
        i = -1;
        j = lenof(distcodes);
        while (1) {
            assert(j - i >= 2);
            k = (j + i) / 2;
            if (distance < distcodes[k].min)
                j = k;
            else if (distance > distcodes[k].max)
                i = k;
            else {
                d = &distcodes[k];
                break;                 /* found it! */
            }
        }

        /*
         * Transmit the distance code. Five bits starting at 00000.
         */
        outbits(out, mirrorbytes[d->code * 8], 5);

        /*
         * Transmit the extra bits.
         */
        if (d->extrabits)
            outbits(out, distance - d->min, d->extrabits);
    }
}